

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O2

double xc_bessel_I0_scaled(double x)

{
  int N;
  double *cs;
  double dVar1;
  double dVar2;
  
  dVar2 = ABS(x);
  if (2.9802322387695312e-08 <= dVar2) {
    if (dVar2 <= 3.0) {
      dVar2 = exp(-dVar2);
      dVar1 = xc_cheb_eval((x * x) / 4.5 + -1.0,bi0_data,0xc);
      dVar2 = (dVar1 + 2.75) * dVar2;
    }
    else {
      if (dVar2 <= 8.0) {
        dVar1 = (48.0 / dVar2 + -11.0) / 5.0;
        cs = ai0_data;
        N = 0x15;
      }
      else {
        dVar1 = 16.0 / dVar2 + -1.0;
        cs = ai02_data;
        N = 0x16;
      }
      dVar1 = xc_cheb_eval(dVar1,cs,N);
      dVar2 = (dVar1 + 0.375) / SQRT(dVar2);
    }
  }
  else {
    dVar2 = 1.0 - dVar2;
  }
  return dVar2;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I0_scaled(const double x)
{
  double y = fabs(x), r = 0.0;

  if(y < 2.0*SQRT_DBL_EPSILON)
    r = 1.0 - y;
  else if(y <= 3.0)
    r = exp(-y)*(2.75 + xc_cheb_eval(y*y/4.5-1.0, bi0_data, 12));
  else if(y <= 8.0)
    r = (.375 + xc_cheb_eval((48.0/y - 11.0)/5.0, ai0_data, 21))/sqrt(y);
  else
    r = (.375 + xc_cheb_eval(16.0/y - 1.0, ai02_data, 22))/sqrt(y);

  return r;
}